

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Auth.cpp
# Opt level: O3

Url * __thiscall Vault::Sys::Auth::getUrl(Url *__return_storage_ptr__,Auth *this,Path *path)

{
  long *plVar1;
  size_type sVar2;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  long *local_48 [2];
  long local_38 [2];
  
  plVar1 = *(long **)this;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/v1/sys/auth","");
  sVar2 = (path->value_)._M_string_length;
  if (sVar2 == 0) {
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,(path->value_)._M_dataplus._M_p);
  }
  else {
    Vault::operator+(&local_88,"/",path);
    local_68 = &local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      local_58._8_8_ = local_88.field_2._8_8_;
    }
    else {
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_dataplus._M_p;
    }
    local_58._M_allocated_capacity._1_7_ = local_88.field_2._M_allocated_capacity._1_7_;
    local_58._M_local_buf[0] = local_88.field_2._M_local_buf[0];
    local_60 = local_88._M_string_length;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_48,&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58._M_allocated_capacity + 1);
  }
  if ((sVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Auth::getUrl(const Path &path) const {
  return client_.getUrl("/v1/sys/auth", path.empty() ? path : Path{"/" + path});
}